

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<fmt::v7::basic_string_view<char>,int_const&>
          (logger *this,source_loc loc,level_enum lvl,basic_string_view<char> *fmt,int *args)

{
  source_loc loc_00;
  char *s;
  size_t count;
  exception *ex;
  string_view_t local_208;
  string_view_t local_1f8;
  char *local_1e8;
  int iStack_1e0;
  undefined4 uStack_1dc;
  char *local_1d8;
  undefined1 local_1d0 [8];
  log_msg log_msg;
  allocator<char> local_151;
  undefined1 local_150 [8];
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int *args_local;
  basic_string_view<char> *fmt_local;
  level_enum lvl_local;
  logger *this_local;
  
  buf._287_1_ = should_log(this,lvl);
  buf._286_1_ = details::backtracer::enabled(&this->tracer_);
  if (((buf._287_1_ & 1) != 0) || ((bool)buf._286_1_)) {
    std::allocator<char>::allocator();
    ::fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_150,&local_151);
    std::allocator<char>::~allocator(&local_151);
    log_msg.payload.size_ =
         (size_t)::fmt::v7::format_to<fmt::v7::basic_string_view<char>,int_const&,250ul,char>
                           ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_150,fmt
                            ,args);
    local_1d8 = loc.funcname;
    local_1e8 = loc.filename;
    iStack_1e0 = loc.line;
    uStack_1dc = loc._12_4_;
    ::fmt::v7::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>(&local_1f8,&this->name_);
    s = ::fmt::v7::detail::buffer<char>::data((buffer<char> *)local_150);
    count = ::fmt::v7::detail::buffer<char>::size((buffer<char> *)local_150);
    ::fmt::v7::basic_string_view<char>::basic_string_view(&local_208,s,count);
    loc_00.line = iStack_1e0;
    loc_00._12_4_ = uStack_1dc;
    loc_00.filename = local_1e8;
    loc_00.funcname = local_1d8;
    details::log_msg::log_msg((log_msg *)local_1d0,loc_00,local_1f8,lvl,local_208);
    log_it_(this,(log_msg *)local_1d0,(bool)(buf._287_1_ & 1),(bool)(buf._286_1_ & 1));
    ::fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_150);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, const FormatString &fmt, Args&&...args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::format_to(buf, fmt, std::forward<Args>(args)...);
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }